

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *this,DenseIndex rows,
          DenseIndex cols,DenseIndex depth)

{
  DenseIndex in_RCX;
  DenseIndex in_RDX;
  DenseIndex in_RSI;
  level3_blocking<double,_double> *in_RDI;
  long *unaff_retaddr;
  
  level3_blocking<double,_double>::level3_blocking(in_RDI);
  in_RDI->m_mc = in_RSI;
  in_RDI->m_nc = in_RDX;
  in_RDI->m_kc = in_RCX;
  computeProductBlockingSizes<double,double,4,long>((long *)cols,(long *)depth,unaff_retaddr);
  in_RDI[1].m_blockA = (LhsScalar *)(in_RDI->m_mc * in_RDI->m_kc);
  in_RDI[1].m_blockB = (RhsScalar *)(in_RDI->m_kc * in_RDI->m_nc);
  in_RDI[1].m_blockW = (RhsScalar *)(in_RDI->m_kc << 3);
  return;
}

Assistant:

gemm_blocking_space(DenseIndex rows, DenseIndex cols, DenseIndex depth)
    {
      this->m_mc = Transpose ? cols : rows;
      this->m_nc = Transpose ? rows : cols;
      this->m_kc = depth;

      computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, this->m_nc);
      m_sizeA = this->m_mc * this->m_kc;
      m_sizeB = this->m_kc * this->m_nc;
      m_sizeW = this->m_kc*Traits::WorkSpaceFactor;
    }